

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O2

Promise<kj::AuthenticatedStream> __thiscall
kj::anon_unknown_0::NetworkAddressImpl::connectAuthenticated(NetworkAddressImpl *this)

{
  size_t in_RCX;
  long in_RSI;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> content;
  ArrayPtr<kj::(anonymous_namespace)::SocketAddress> addrs;
  Promise<kj::AuthenticatedStream> promise;
  Array<kj::(anonymous_namespace)::SocketAddress> addrsCopy;
  
  content.size_ = in_RCX;
  content.ptr = *(SocketAddress **)(in_RSI + 0x20);
  heapArray<kj::(anonymous_namespace)::SocketAddress>(&addrsCopy,*(kj **)(in_RSI + 0x18),content);
  addrs.size_ = (size_t)addrsCopy.ptr;
  addrs.ptr = *(SocketAddress **)(in_RSI + 0x10);
  connectImpl((LowLevelAsyncIoProvider *)&promise,*(NetworkFilter **)(in_RSI + 8),addrs,
              (bool)(undefined1)addrsCopy.size_);
  Promise<kj::AuthenticatedStream>::attach<kj::Array<kj::(anonymous_namespace)::SocketAddress>>
            ((Promise<kj::AuthenticatedStream> *)this,
             (Array<kj::(anonymous_namespace)::SocketAddress> *)&promise);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
            ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&promise);
  Array<kj::(anonymous_namespace)::SocketAddress>::~Array(&addrsCopy);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<AuthenticatedStream> connectAuthenticated() override {
    auto addrsCopy = heapArray(addrs.asPtr());
    auto promise = connectImpl(lowLevel, filter, addrsCopy, true);
    return promise.attach(kj::mv(addrsCopy));
  }